

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string2.cpp
# Opt level: O3

void __thiscall String::String(String *this,String *rhs)

{
  size_t sVar1;
  char *__dest;
  
  sVar1 = strlen(rhs->data_);
  __dest = (char *)operator_new__(sVar1 + 1);
  this->data_ = __dest;
  strcpy(__dest,rhs->data_);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"String::String(const String&)",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  return;
}

Assistant:

String(const String& rhs)
    : data_(new char[rhs.size() + 1])
  {
    strcpy(data_, rhs.c_str());
    std::cout << "String::String(const String&)" << std::endl;
  }